

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

TARGET_HANDLE target_clone(TARGET_HANDLE value)

{
  AMQP_VALUE pAVar1;
  TARGET_HANDLE local_18;
  TARGET_INSTANCE *target_instance;
  TARGET_HANDLE value_local;
  
  local_18 = (TARGET_HANDLE)malloc(8);
  if (local_18 != (TARGET_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (TARGET_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

TARGET_HANDLE target_clone(TARGET_HANDLE value)
{
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)malloc(sizeof(TARGET_INSTANCE));
    if (target_instance != NULL)
    {
        target_instance->composite_value = amqpvalue_clone(((TARGET_INSTANCE*)value)->composite_value);
        if (target_instance->composite_value == NULL)
        {
            free(target_instance);
            target_instance = NULL;
        }
    }

    return target_instance;
}